

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O1

void BamTools::Internal::BamStandardIndex::CheckBufferSize
               (uchar **buffer,uint *bufferLength,uint *requestedBytes)

{
  uchar *puVar1;
  stringstream s;
  
  if (*bufferLength < *requestedBytes) {
    *bufferLength = *requestedBytes + 10;
    if (*buffer != (uchar *)0x0) {
      operator_delete__(*buffer);
    }
    puVar1 = (uchar *)operator_new__((ulong)*bufferLength);
    *buffer = puVar1;
  }
  return;
}

Assistant:

void BamStandardIndex::CheckBufferSize(unsigned char*& buffer, unsigned int& bufferLength,
                                       const unsigned int& requestedBytes)
{
    try {
        if (requestedBytes > bufferLength) {
            bufferLength = requestedBytes + 10;
            delete[] buffer;
            buffer = new unsigned char[bufferLength];
        }
    } catch (std::bad_alloc&) {
        std::stringstream s;
        s << "out of memory when allocating " << requestedBytes << " bytes";
        throw BamException("BamStandardIndex::CheckBufferSize", s.str());
    }
}